

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

gguf_type gguf_get_kv_type(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  const_reference pvVar2;
  gguf_type *pgVar3;
  size_type in_RSI;
  long in_RDI;
  gguf_type local_1c;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18f00a);
    if ((long)in_RSI < iVar1) {
      pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                         ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      if ((pvVar2->is_array & 1U) == 0) {
        pvVar2 = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                           ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
        pgVar3 = gguf_kv::get_type(pvVar2);
        local_1c = *pgVar3;
      }
      else {
        local_1c = GGUF_TYPE_ARRAY;
      }
      return local_1c;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x300,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

enum gguf_type gguf_get_kv_type(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    return ctx->kv[key_id].is_array ? GGUF_TYPE_ARRAY : ctx->kv[key_id].get_type();
}